

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

uint __thiscall ON_V5_MeshDoubleVertices::SizeOf(ON_V5_MeshDoubleVertices *this)

{
  int iVar1;
  uint uVar2;
  
  iVar1 = (this->m_V5_dV).super_ON_SimpleArray<ON_3dPoint>.m_capacity;
  uVar2 = ON_UserData::SizeOf(&this->super_ON_UserData);
  return uVar2 + iVar1 * 0x18;
}

Assistant:

bool
ON_MeshFace::IsValid(unsigned int mesh_vertex_count) const
{
  const unsigned int* uvi = (const unsigned int*)vi;
  return (uvi[0] < mesh_vertex_count
    && uvi[1] < mesh_vertex_count
    && uvi[2] < mesh_vertex_count
    && uvi[3] < mesh_vertex_count
    && uvi[0] != uvi[1] && uvi[1] != uvi[2] && uvi[2] != uvi[0]
    && (uvi[2] == uvi[3] || (uvi[0] != uvi[3] && uvi[1] != uvi[3])));
}